

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  string *psVar5;
  IConfig *pIVar6;
  Colour local_11;
  ConsoleReporter *pCStack_10;
  Colour colour;
  ConsoleReporter *this_local;
  
  pCStack_10 = this;
  poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  pcVar4 = getLineOfChars<(char)126>();
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,"\n");
  Colour::Colour(&local_11,FileName);
  poVar3 = (this->super_StreamingReporterBase).stream;
  psVar5 = (string *)
           Option<Catch::TestRunInfo>::operator->
                     (&(this->super_StreamingReporterBase).currentTestRunInfo.
                       super_Option<Catch::TestRunInfo>);
  poVar3 = std::operator<<(poVar3,psVar5);
  poVar3 = std::operator<<(poVar3," is a Catch v");
  poVar3 = Catch::operator<<(poVar3,(Version *)libraryVersion);
  poVar3 = std::operator<<(poVar3," host application.\n");
  std::operator<<(poVar3,"Run with -? for options\n\n");
  pIVar6 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
  iVar1 = (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
  if (iVar1 != 0) {
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"Randomness seeded to: ");
    pIVar6 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
    uVar2 = (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::operator<<(poVar3,"\n\n");
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour(&local_11);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion << " host application.\n"
                    << "Run with -? for options\n\n";

            if( m_config->rngSeed() != 0 )
                stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

            currentTestRunInfo.used = true;
        }